

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O2

ma_result ma_linear_resampler_set_rate_internal
                    (ma_linear_resampler *pResampler,void *pHeap,
                    ma_linear_resampler_heap_layout *pHeapLayout,ma_uint32 sampleRateIn,
                    ma_uint32 sampleRateOut,ma_bool32 isResamplerAlreadyInitialized)

{
  ulong uVar1;
  ma_uint32 mVar2;
  uint uVar3;
  uint uVar4;
  ma_result mVar5;
  uint uVar6;
  ma_uint32 t;
  ma_uint32 mVar7;
  ma_lpf_config local_38;
  
  mVar5 = MA_INVALID_ARGS;
  if ((pResampler != (ma_linear_resampler *)0x0) && (sampleRateOut != 0 && sampleRateIn != 0)) {
    uVar6 = (pResampler->config).sampleRateOut;
    mVar2 = sampleRateOut;
    mVar7 = sampleRateIn;
    while (uVar3 = mVar2, uVar3 != 0) {
      mVar2 = mVar7 % uVar3;
      mVar7 = uVar3;
    }
    uVar3 = (uint)((ulong)sampleRateIn / (ulong)mVar7);
    (pResampler->config).sampleRateIn = uVar3;
    uVar4 = (uint)((ulong)sampleRateOut / (ulong)mVar7);
    (pResampler->config).sampleRateOut = uVar4;
    local_38.order = (pResampler->config).lpfOrder;
    if (local_38.order < 9) {
      local_38.sampleRate = uVar4;
      if (uVar3 >= uVar4 && uVar3 != uVar4) {
        local_38.sampleRate = uVar3;
      }
      uVar1 = (ulong)sampleRateOut / (ulong)mVar7;
      if (uVar3 < uVar4) {
        uVar1 = (ulong)sampleRateIn / (ulong)mVar7;
      }
      local_38.cutoffFrequency = (double)uVar1 * 0.5 * (pResampler->config).lpfNyquistFactor;
      local_38.format = (pResampler->config).format;
      local_38.channels = (pResampler->config).channels;
      local_38._12_4_ = 0;
      local_38._28_4_ = 0;
      if (isResamplerAlreadyInitialized == 0) {
        mVar5 = ma_lpf_init_preallocated
                          (&local_38,(void *)((long)pHeap + pHeapLayout->lpfOffset),&pResampler->lpf
                          );
      }
      else {
        mVar5 = ma_lpf_reinit(&local_38,&pResampler->lpf);
      }
      if (mVar5 == MA_SUCCESS) {
        uVar3 = (pResampler->config).sampleRateIn;
        uVar4 = (pResampler->config).sampleRateOut;
        pResampler->inAdvanceInt = uVar3 / uVar4;
        pResampler->inAdvanceFrac = uVar3 % uVar4;
        uVar6 = ((pResampler->inTimeFrac % uVar6) * uVar4) / uVar6 +
                (pResampler->inTimeFrac / uVar6) * uVar4;
        pResampler->inTimeInt = pResampler->inTimeInt + uVar6 / uVar4;
        mVar5 = MA_SUCCESS;
        pResampler->inTimeFrac = uVar6 % uVar4;
      }
    }
  }
  return mVar5;
}

Assistant:

static ma_result ma_linear_resampler_set_rate_internal(ma_linear_resampler* pResampler, void* pHeap, ma_linear_resampler_heap_layout* pHeapLayout, ma_uint32 sampleRateIn, ma_uint32 sampleRateOut, ma_bool32 isResamplerAlreadyInitialized)
{
    ma_result result;
    ma_uint32 gcf;
    ma_uint32 lpfSampleRate;
    double lpfCutoffFrequency;
    ma_lpf_config lpfConfig;
    ma_uint32 oldSampleRateOut; /* Required for adjusting time advance down the bottom. */

    if (pResampler == NULL) {
        return MA_INVALID_ARGS;
    }

    if (sampleRateIn == 0 || sampleRateOut == 0) {
        return MA_INVALID_ARGS;
    }

    oldSampleRateOut = pResampler->config.sampleRateOut;

    pResampler->config.sampleRateIn  = sampleRateIn;
    pResampler->config.sampleRateOut = sampleRateOut;

    /* Simplify the sample rate. */
    gcf = ma_gcf_u32(pResampler->config.sampleRateIn, pResampler->config.sampleRateOut);
    pResampler->config.sampleRateIn  /= gcf;
    pResampler->config.sampleRateOut /= gcf;

    /* Always initialize the low-pass filter, even when the order is 0. */
    if (pResampler->config.lpfOrder > MA_MAX_FILTER_ORDER) {
        return MA_INVALID_ARGS;
    }

    lpfSampleRate      = (ma_uint32)(ma_max(pResampler->config.sampleRateIn, pResampler->config.sampleRateOut));
    lpfCutoffFrequency = (   double)(ma_min(pResampler->config.sampleRateIn, pResampler->config.sampleRateOut) * 0.5 * pResampler->config.lpfNyquistFactor);

    lpfConfig = ma_lpf_config_init(pResampler->config.format, pResampler->config.channels, lpfSampleRate, lpfCutoffFrequency, pResampler->config.lpfOrder);

    /*
    If the resampler is alreay initialized we don't want to do a fresh initialization of the low-pass filter because it will result in the cached frames
    getting cleared. Instead we re-initialize the filter which will maintain any cached frames.
    */
    if (isResamplerAlreadyInitialized) {
        result = ma_lpf_reinit(&lpfConfig, &pResampler->lpf);
    } else {
        result = ma_lpf_init_preallocated(&lpfConfig, ma_offset_ptr(pHeap, pHeapLayout->lpfOffset), &pResampler->lpf);
    }

    if (result != MA_SUCCESS) {
        return result;
    }


    pResampler->inAdvanceInt  = pResampler->config.sampleRateIn / pResampler->config.sampleRateOut;
    pResampler->inAdvanceFrac = pResampler->config.sampleRateIn % pResampler->config.sampleRateOut;

    /* Our timer was based on the old rate. We need to adjust it so that it's based on the new rate. */
    ma_linear_resampler_adjust_timer_for_new_rate(pResampler, oldSampleRateOut, pResampler->config.sampleRateOut);

    return MA_SUCCESS;
}